

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvr.c
# Opt level: O0

int cvrMain(int argc,char **argv)

{
  int iVar1;
  err_t code_00;
  char *pcVar2;
  long in_RSI;
  int in_EDI;
  err_t code;
  char **in_stack_00000028;
  int in_stack_00000030;
  char **in_stack_00000038;
  int in_stack_00000040;
  char **in_stack_00000068;
  int in_stack_00000070;
  uint in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  int local_4;
  
  if (in_EDI < 2) {
    local_4 = cvrUsage();
  }
  else {
    pcVar2 = (char *)(in_RSI + 8);
    iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (iVar1 == 0) {
      code_00 = cvrCreate(argc,argv);
    }
    else {
      iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
      if (iVar1 == 0) {
        code_00 = cvrAdd(in_stack_00000070,in_stack_00000068);
      }
      else {
        iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8))
        ;
        if (iVar1 == 0) {
          code_00 = cvrDel(in_stack_00000070,in_stack_00000068);
        }
        else {
          iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8
                                                ));
          if (iVar1 == 0) {
            code_00 = cvrVal(in_stack_00000030,in_stack_00000028);
          }
          else {
            iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,
                                                   in_stack_ffffffffffffffe8));
            if (iVar1 == 0) {
              code_00 = cvrFind(in_stack_00000040,in_stack_00000038);
            }
            else {
              iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,
                                                     in_stack_ffffffffffffffe8));
              if (iVar1 == 0) {
                code_00 = cvrExtr(in_stack_00000040,in_stack_00000038);
              }
              else {
                iVar1 = strCmp(pcVar2,(char *)CONCAT44(in_stack_ffffffffffffffec,
                                                       in_stack_ffffffffffffffe8));
                if (iVar1 == 0) {
                  code_00 = cvrPrint(in_stack_00000030,in_stack_00000028);
                }
                else {
                  code_00 = 0x259;
                }
              }
            }
          }
        }
      }
    }
    if (((code_00 != 0) ||
        (iVar1 = strCmp(pcVar2,(char *)(ulong)in_stack_ffffffffffffffe8), iVar1 == 0)) ||
       (iVar1 = strCmp(pcVar2,(char *)CONCAT44(code_00,in_stack_ffffffffffffffe8)), iVar1 == 0)) {
      pcVar2 = errMsg(code_00);
      printf("bee2cmd/%s: %s\n","cvr",pcVar2);
    }
    local_4 = 0;
    if (code_00 != 0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int cvrMain(int argc, char* argv[])
{
	err_t code;
	// справка
	if (argc < 2)
		return cvrUsage();
	// разбор команды
	++argv, --argc;
	if (strEq(argv[0], "init"))
		code = cvrCreate(argc - 1, argv + 1);
	else if (strEq(argv[0], "add"))
		code = cvrAdd(argc - 1, argv + 1);
	else if (strEq(argv[0], "del"))
		code = cvrDel(argc - 1, argv + 1);
	else if (strEq(argv[0], "val"))
		code = cvrVal(argc - 1, argv + 1);
	else if (strEq(argv[0], "find"))
		code = cvrFind(argc - 1, argv + 1);
	else if (strEq(argv[0], "extr"))
		code = cvrExtr(argc - 1, argv + 1);
	else if (strEq(argv[0], "print"))
		code = cvrPrint(argc - 1, argv + 1);
	else
		code = ERR_CMD_NOT_FOUND;
	// завершить
	if (code != ERR_OK || strEq(argv[0], "val") || strEq(argv[0], "find"))
		printf("bee2cmd/%s: %s\n", _name, errMsg(code));
	return code != ERR_OK ? -1 : 0;
}